

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.h
# Opt level: O3

void __thiscall Js::ArgumentReader::AdjustArguments(ArgumentReader *this,CallInfo *callInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type TVar4;
  
  TVar4 = (this->super_Arguments).Info;
  if ((TVar4._0_4_ & 0x48000000) == 0x40000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/Arguments.h"
                                ,0x121,
                                "(!this->HasNewTarget() || (Info.Flags & Js::CallFlags_ExtraArg))",
                                "NewTarget flag must be used together with ExtraArg.");
    if (!bVar2) goto LAB_003ffce0;
    *puVar3 = 0;
    TVar4 = (this->super_Arguments).Info;
  }
  if ((TVar4._0_4_ >> 0x1b & 1) != 0) {
    if (((ulong)TVar4 & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/Arguments.h"
                                  ,0x126,"(Info.Count > 0)","Info.Count > 0");
      if (!bVar2) {
LAB_003ffce0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      TVar4 = (this->super_Arguments).Info;
    }
    (this->super_Arguments).Info = (Type)((ulong)TVar4 & 0xfffffffff7ffffff);
    callInfo->field_0x3 = callInfo->field_0x3 & 0xf7;
  }
  return;
}

Assistant:

void AdjustArguments(CallInfo *callInfo)
        {
            AssertMsg(!this->HasNewTarget() || (Info.Flags & Js::CallFlags_ExtraArg), "NewTarget flag must be used together with ExtraArg.");
            if (Info.Flags & Js::CallFlags_ExtraArg)
            {
                // If "calling eval" is set, then the last param is the frame display, which only
                // the eval built-in should see.
                Assert(Info.Count > 0);
                // The local version should be consistent. On the other hand, lots of code throughout
                // jscript uses the callInfo from stack to get argument list etc. We'll need
                // to change all the caller to be aware of the id or somehow make sure they don't use
                // the stack version. Both seem risky. It would be safer and more robust to just
                // change the stack version.
                Info.Flags = (CallFlags)(Info.Flags & ~Js::CallFlags_ExtraArg);
                callInfo->Flags = (CallFlags)(callInfo->Flags & ~Js::CallFlags_ExtraArg);
            }
        }